

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaVStart(xmlSchemaValidCtxtPtr vctxt)

{
  xmlElementType nodeType;
  xmlNodePtr pxVar1;
  xmlChar *localName;
  int iVar2;
  int iVar3;
  xmlNodePtr pxVar4;
  char *message;
  _xmlNode *p_Var5;
  char *funcName;
  xmlChar *in_R8;
  int *in_R9;
  xmlSchemaNodeInfoPtr pxVar6;
  xmlChar *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  
  iVar2 = xmlSchemaPreRun(vctxt);
  if (iVar2 < 0) {
    return -1;
  }
  if (vctxt->doc == (xmlDoc *)0x0) {
    iVar2 = 0;
    if (vctxt->reader != (xmlTextReaderPtr)0x0) goto LAB_001b0d07;
    if ((vctxt->sax != (xmlSAXHandlerPtr)0x0) && (vctxt->parserCtxt != (xmlParserCtxtPtr)0x0)) {
      iVar2 = xmlParseDocument(vctxt->parserCtxt);
      goto LAB_001b0d07;
    }
    funcName = "xmlSchemaVStart";
    message = "no instance to validate";
  }
  else {
    pxVar4 = vctxt->validationRoot;
    if (pxVar4 == (xmlNodePtr)0x0) {
      pxVar4 = xmlDocGetRootElement(vctxt->doc);
    }
    if (pxVar4 == (xmlNodePtr)0x0) {
      iVar2 = 1;
      xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)vctxt,XML_ERR_INTERNAL_ERROR,(xmlNodePtr)0x0,
                          (xmlSchemaBasicItemPtr)0x0,"The document has no document element",
                          (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
      goto LAB_001b0d07;
    }
    vctxt->depth = -1;
    vctxt->validationRoot = pxVar4;
    pxVar6 = (xmlSchemaNodeInfoPtr)0x0;
    pxVar1 = pxVar4;
LAB_001b0a65:
    p_Var5 = pxVar1;
    if ((vctxt->skipDepth != -1) && (vctxt->skipDepth <= vctxt->depth)) goto LAB_001b0c17;
    nodeType = p_Var5->type;
    if (1 < nodeType - XML_TEXT_NODE) {
      if (nodeType == XML_ELEMENT_NODE) {
        vctxt->depth = vctxt->depth + 1;
        iVar3 = xmlSchemaValidatorPushElem(vctxt);
        iVar2 = -1;
        if (iVar3 == -1) goto LAB_001b0d07;
        pxVar6 = vctxt->inode;
        pxVar6->node = p_Var5;
        pxVar6->nodeLine = (uint)p_Var5->line;
        pxVar6->localName = p_Var5->name;
        if (p_Var5->ns != (xmlNs *)0x0) {
          pxVar6->nsName = p_Var5->ns->href;
        }
        *(byte *)&pxVar6->flags = (byte)pxVar6->flags | 0x20;
        vctxt->nbAttrInfos = 0;
        for (pxVar1 = (xmlNodePtr)p_Var5->properties; pxVar1 != (xmlNodePtr)0x0;
            pxVar1 = pxVar1->next) {
          if (pxVar1->ns == (xmlNs *)0x0) {
            in_R8 = (xmlChar *)0x0;
          }
          else {
            in_R8 = pxVar1->ns->href;
          }
          iVar2 = pxVar6->nodeLine;
          localName = pxVar1->name;
          in_R9 = (int *)xmlNodeListGetString(pxVar1->doc,pxVar1->children,1);
          iVar2 = xmlSchemaValidatorPushAttribute
                            (vctxt,pxVar1,iVar2,localName,in_R8,(int)in_R9,in_stack_ffffffffffffffa8
                             ,(int)in_stack_ffffffffffffffb0);
          if (iVar2 == -1) {
            funcName = "xmlSchemaDocWalk";
            message = "calling xmlSchemaValidatorPushAttribute()";
            goto LAB_001b0cf8;
          }
        }
        iVar2 = xmlSchemaValidateElem(vctxt);
        if (iVar2 != 0) {
          if (iVar2 != -1) goto LAB_001b0bea;
          funcName = "xmlSchemaDocWalk";
          message = "calling xmlSchemaValidateElem()";
          goto LAB_001b0cf8;
        }
        if ((vctxt->skipDepth == -1) || (vctxt->depth < vctxt->skipDepth)) goto LAB_001b0ad7;
      }
      else if (nodeType - XML_ENTITY_REF_NODE < 2) {
        funcName = "xmlSchemaVDocWalk";
        message = 
        "there is at least one entity reference in the node-tree currently being validated. Processing of entities with this XML Schema processor is not supported (yet). Please substitute entities before validation."
        ;
        goto LAB_001b0cf8;
      }
      goto LAB_001b0bea;
    }
    if ((pxVar6 != (xmlSchemaNodeInfoPtr)0x0) && ((pxVar6->flags & 0x20U) != 0)) {
      pxVar6->flags = pxVar6->flags & 0xffffffdf;
    }
    in_R8 = &DAT_00000001;
    iVar2 = xmlSchemaVPushText(vctxt,nodeType,p_Var5->content,-1,1,in_R9);
    if (-1 < iVar2) goto LAB_001b0ad7;
    funcName = "xmlSchemaVDocWalk";
    message = "calling xmlSchemaVPushText()";
  }
LAB_001b0cf8:
  xmlSchemaInternalErr2((xmlSchemaAbstractCtxtPtr)vctxt,funcName,message,(xmlChar *)0x0,in_R8);
  iVar2 = -1;
LAB_001b0d07:
  xmlSchemaPostRun(vctxt);
  if (iVar2 == 0) {
    iVar2 = vctxt->err;
  }
  return iVar2;
LAB_001b0ad7:
  pxVar1 = p_Var5->children;
  if (p_Var5->children != (_xmlNode *)0x0) goto LAB_001b0a65;
LAB_001b0bea:
  while( true ) {
    if (p_Var5->type == XML_ELEMENT_NODE) {
      if (p_Var5 != vctxt->inode->node) {
        funcName = "xmlSchemaVDocWalk";
        message = "element position mismatch";
        goto LAB_001b0cf8;
      }
      iVar2 = xmlSchemaValidatorPopElem(vctxt);
      if (iVar2 < 0) {
        funcName = "xmlSchemaVDocWalk";
        message = "calling xmlSchemaValidatorPopElem()";
        goto LAB_001b0cf8;
      }
      if (p_Var5 == pxVar4) goto LAB_001b0d07;
    }
LAB_001b0c17:
    pxVar1 = p_Var5->next;
    if (p_Var5->next != (_xmlNode *)0x0) break;
    p_Var5 = p_Var5->parent;
  }
  goto LAB_001b0a65;
}

Assistant:

static int
xmlSchemaVStart(xmlSchemaValidCtxtPtr vctxt)
{
    int ret = 0;

    if (xmlSchemaPreRun(vctxt) < 0)
        return(-1);

    if (vctxt->doc != NULL) {
	/*
	 * Tree validation.
	 */
	ret = xmlSchemaVDocWalk(vctxt);
#ifdef LIBXML_READER_ENABLED
    } else if (vctxt->reader != NULL) {
	/*
	 * XML Reader validation.
	 */
#ifdef XML_SCHEMA_READER_ENABLED
	ret = xmlSchemaVReaderWalk(vctxt);
#endif
#endif
    } else if ((vctxt->sax != NULL) && (vctxt->parserCtxt != NULL)) {
	/*
	 * SAX validation.
	 */
	ret = xmlParseDocument(vctxt->parserCtxt);
    } else {
	VERROR_INT("xmlSchemaVStart",
	    "no instance to validate");
	ret = -1;
    }

    xmlSchemaPostRun(vctxt);
    if (ret == 0)
	ret = vctxt->err;
    return (ret);
}